

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::CopyPropagateArrays::IsAccessChainIndexValidAndEqualTo
          (CopyPropagateArrays *this,AccessChainEntry *entry,uint32_t value)

{
  IRContext *this_00;
  int iVar1;
  uint32_t uVar2;
  Constant *this_01;
  undefined4 extraout_var;
  bool bVar3;
  
  if (entry->is_result_id == false) {
    uVar2 = (entry->field_1).result_id;
LAB_0058fcc6:
    bVar3 = uVar2 == value;
  }
  else {
    this_00 = (this->super_MemPass).super_Pass.context_;
    if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
      IRContext::BuildConstantManager(this_00);
    }
    this_01 = analysis::ConstantManager::FindDeclaredConstant
                        ((this_00->constant_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                         _M_head_impl,(entry->field_1).result_id);
    if (this_01 != (Constant *)0x0) {
      iVar1 = (*this_01->type_->_vptr_Type[10])();
      if (CONCAT44(extraout_var,iVar1) != 0) {
        uVar2 = analysis::Constant::GetU32(this_01);
        goto LAB_0058fcc6;
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CopyPropagateArrays::IsAccessChainIndexValidAndEqualTo(
    const AccessChainEntry& entry, uint32_t value) const {
  if (!entry.is_result_id) {
    return entry.immediate == value;
  }

  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  const analysis::Constant* constant =
      const_mgr->FindDeclaredConstant(entry.result_id);
  if (!constant || !constant->type()->AsInteger()) {
    return false;
  }
  return constant->GetU32() == value;
}